

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_not(CTcPrsNode *subexpr)

{
  CTcPrsNode *ret;
  CTcPrsNode *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  local_8 = (CTPNNot *)eval_const_not(in_stack_ffffffffffffffc8);
  if (local_8 == (CTPNNot *)0x0) {
    local_8 = (CTPNNot *)CTcPrsAllocObj::operator_new(0x256ee6);
    CTPNNot::CTPNNot(local_8,in_stack_ffffffffffffffc8);
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_not(CTcPrsNode *subexpr)
{
    /* try folding a constant value */
    CTcPrsNode *ret = eval_const_not(subexpr);

    /* 
     *   if we got a constant result, return it; otherwise, create a NOT
     *   node for code generation 
     */
    if (ret != 0)
        return ret;
    else
        return new CTPNNot(subexpr);
}